

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O2

bool __thiscall QCacheItem::canCompress(QCacheItem *this)

{
  long lVar1;
  bool bVar2;
  qlonglong qVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QByteArrayView other;
  QByteArrayView other_00;
  QByteArrayView other_01;
  QByteArrayView other_02;
  QByteArrayView local_40;
  QByteArrayView local_30;
  QHttpHeaders h;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::headers((QNetworkCacheMetaData *)&h);
  bVar2 = false;
  local_30 = QHttpHeaders::value(&h,ContentLength,(QByteArrayView)ZEXT816(0));
  if (local_30.m_size == 0) goto LAB_001c5aa5;
  bVar2 = false;
  qVar3 = QByteArrayView::toLongLong(&local_30,(bool *)0x0,10);
  if (0x300000 < qVar3) goto LAB_001c5aa5;
  bVar2 = false;
  local_40 = QHttpHeaders::value(&h,ContentType,(QByteArrayView)ZEXT816(0));
  if (local_40.m_size != 0) goto LAB_001c5aa5;
  qVar4 = QByteArrayView::lengthHelperCharArray("text/",6);
  other.m_data = "text/";
  other.m_size = qVar4;
  bVar2 = QByteArrayView::startsWith(&local_40,other);
  if (!bVar2) {
    qVar4 = QByteArrayView::lengthHelperCharArray("application/",0xd);
    other_00.m_data = "application/";
    other_00.m_size = qVar4;
    bVar2 = QByteArrayView::startsWith(&local_40,other_00);
    if (!bVar2) {
LAB_001c5aa3:
      bVar2 = false;
      goto LAB_001c5aa5;
    }
    qVar4 = QByteArrayView::lengthHelperCharArray("javascript",0xb);
    other_01.m_data = "javascript";
    other_01.m_size = qVar4;
    bVar2 = QByteArrayView::endsWith(&local_40,other_01);
    if (!bVar2) {
      qVar4 = QByteArrayView::lengthHelperCharArray("ecmascript",0xb);
      other_02.m_data = "ecmascript";
      other_02.m_size = qVar4;
      bVar2 = QByteArrayView::endsWith(&local_40,other_02);
      if (!bVar2) goto LAB_001c5aa3;
    }
  }
  bVar2 = true;
LAB_001c5aa5:
  QHttpHeaders::~QHttpHeaders(&h);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QCacheItem::canCompress() const
{
    const auto h = metaData.headers();

    const auto sizeValue = h.value(QHttpHeaders::WellKnownHeader::ContentLength);
    if (sizeValue.empty())
        return false;

    qint64 size = sizeValue.toLongLong();
    if (size > MAX_COMPRESSION_SIZE)
        return false;

    const auto type = h.value(QHttpHeaders::WellKnownHeader::ContentType);
    if (!type.empty())
        return false;

    if (!type.startsWith("text/")
        && !(type.startsWith("application/")
            && (type.endsWith("javascript") || type.endsWith("ecmascript")))) {
        return false;
    }

    return true;
}